

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionExecutionStateMachine.cpp
# Opt level: O3

uint16 __thiscall
Js::FunctionExecutionStateMachine::GetProfiledIterations(FunctionExecutionStateMachine *this)

{
  ushort uVar1;
  code *pcVar2;
  bool bVar3;
  ExecutionMode executionMode;
  ushort uVar4;
  uint16 uVar5;
  undefined4 *puVar6;
  char *this_00;
  ushort uVar7;
  
  this_00 = (char *)this;
  if (this->initializedExecutionModeAndLimits == false) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    this_00 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionExecutionStateMachine.cpp"
    ;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionExecutionStateMachine.cpp"
                                ,0x2d9,"(initializedExecutionModeAndLimits)",
                                "initializedExecutionModeAndLimits");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  uVar1 = this->committedProfiledIterations;
  executionMode = StateToMode((FunctionExecutionStateMachine *)this_00,this->executionState);
  VerifyExecutionMode(this,executionMode);
  uVar7 = uVar1;
  if (executionMode == SimpleJit) {
    if (DAT_015a4e4c == '\0') {
      uVar5 = GetSimpleJitExecutedIterations(this);
      uVar7 = 0xffff;
      if (!CARRY2(uVar1,uVar5)) {
        uVar7 = uVar1 + uVar5;
      }
    }
  }
  else if (executionMode == ProfilingInterpreter) {
    uVar4 = (ushort)this->interpretedCount;
    if (0xfffe < this->interpretedCount) {
      uVar4 = 0xffff;
    }
    uVar7 = uVar1 + uVar4;
    if (CARRY2(uVar1,uVar4)) {
      uVar7 = 0xffff;
    }
  }
  return uVar7;
}

Assistant:

uint16 FunctionExecutionStateMachine::GetProfiledIterations() const
    {
        Assert(initializedExecutionModeAndLimits);

        uint16 profiledIterations = committedProfiledIterations;
        switch (GetExecutionMode())
        {
        case ExecutionMode::ProfilingInterpreter:
        {
            uint32 interpretedCount = GetInterpretedCount();
            const uint16 clampedInterpretedCount =
                interpretedCount <= UINT16_MAX
                ? static_cast<uint16>(interpretedCount)
                : UINT16_MAX;
            const uint16 newProfiledIterations = profiledIterations + clampedInterpretedCount;
            profiledIterations = newProfiledIterations >= profiledIterations ? newProfiledIterations : UINT16_MAX;
            break;
        }

        case ExecutionMode::SimpleJit:
            if (!CONFIG_FLAG(NewSimpleJit))
            {
                const uint16 newProfiledIterations = profiledIterations + GetSimpleJitExecutedIterations();
                profiledIterations = newProfiledIterations >= profiledIterations ? newProfiledIterations : UINT16_MAX;
            }
            break;
        }
        return profiledIterations;
    }